

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spmd.cc
# Opt level: O3

int __thiscall bsplib::Spmd::close(Spmd *this,int __fd)

{
  int iVar1;
  
  MPI_Barrier(&ompi_mpi_comm_world);
  this->m_closed = true;
  MPI_Comm_free(this);
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  iVar1 = MPI_Finalize();
  return iVar1;
}

Assistant:

void Spmd :: close() {
    // wait for inactive & active processes to synchronize
    MPI_Barrier( MPI_COMM_WORLD );
    m_closed = true;

    MPI_Comm_free( &m_comm );
    m_comm = MPI_COMM_NULL;

    MPI_Finalize();
}